

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# packed_gamma_file3.hpp
# Opt level: O0

void __thiscall
packed_gamma_file3<unsigned_int,_6UL>::fill_bits(packed_gamma_file3<unsigned_int,_6UL> *this)

{
  byte bVar1;
  long in_RDI;
  int j;
  uint8_t x;
  bool in_stack_0000004f;
  vector<bool,_std::allocator<bool>_> *in_stack_00000050;
  int local_10;
  undefined1 local_9 [9];
  
  while (bVar1 = std::ios::eof(), ((bVar1 ^ 0xff) & 1) != 0) {
    std::istream::read((char *)(in_RDI + 0x90),(long)local_9);
    for (local_10 = 0; local_10 < 8; local_10 = local_10 + 1) {
      std::vector<bool,_std::allocator<bool>_>::push_back(in_stack_00000050,in_stack_0000004f);
    }
  }
  return;
}

Assistant:

void fill_bits(){

		//first of all, delete from bits all bits that have already been read

		assert(idx_in_bits==0);

		while(not in.eof()){

			uint8_t x;
			in.read((char*)&x,1);

			//push back bits of x in vector bits
			for(int j=0;j<8;++j) bits.push_back( (x>>(7-j)) & uint8_t(1) );

		}

	}